

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt1.cpp
# Opt level: O0

void __thiscall
crnlib::dxt1_endpoint_optimizer::dxt1_endpoint_optimizer(dxt1_endpoint_optimizer *this)

{
  vector<crnlib::unique_color> *pvVar1;
  undefined8 *in_RDI;
  potential_solution *in_stack_ffffffffffffff50;
  uint new_capacity;
  vector<crnlib::unique_color> *this_00;
  vector<crnlib::unique_color> *local_78;
  
  *in_RDI = 0;
  in_RDI[1] = 0;
  *(undefined1 *)(in_RDI + 2) = 0;
  hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  ::hash_map((hash_map<unsigned_int,_unsigned_int,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
              *)in_stack_ffffffffffffff50);
  vector<crnlib::unique_color>::vector((vector<crnlib::unique_color> *)(in_RDI + 7));
  vector<crnlib::unique_color>::vector((vector<crnlib::unique_color> *)(in_RDI + 9));
  vector<crnlib::unique_color>::vector((vector<crnlib::unique_color> *)(in_RDI + 0xb));
  vector<crnlib::vec<3U,_float>_>::vector((vector<crnlib::vec<3U,_float>_> *)(in_RDI + 0x10e));
  vec<3U,_float>::vec((vec<3U,_float> *)(in_RDI + 0x110));
  vector<crnlib::vec<3U,_float>_>::vector((vector<crnlib::vec<3U,_float>_> *)(in_RDI + 0x112));
  vec<3U,_float>::vec((vec<3U,_float> *)(in_RDI + 0x114));
  vec<3U,_float>::vec((vec<3U,_float> *)((long)in_RDI + 0x8ac));
  vector<unsigned_short>::vector((vector<unsigned_short> *)(in_RDI + 0x117));
  vector<unsigned_char>::vector((vector<unsigned_char> *)(in_RDI + 0x119));
  vector<crnlib::vec<3U,_float>_>::vector((vector<crnlib::vec<3U,_float>_> *)(in_RDI + 0x11b));
  vector<crnlib::vec<3U,_float>_>::vector((vector<crnlib::vec<3U,_float>_> *)(in_RDI + 0x11d));
  this_00 = (vector<crnlib::unique_color> *)(in_RDI + 0x121);
  pvVar1 = (vector<crnlib::unique_color> *)(in_RDI + 0x11f);
  do {
    local_78 = pvVar1;
    dxt1_solution_coordinates::dxt1_solution_coordinates((dxt1_solution_coordinates *)local_78);
    pvVar1 = (vector<crnlib::unique_color> *)((long)&local_78->m_p + 4);
  } while (pvVar1 != this_00);
  *(undefined4 *)(in_RDI + 0x121) = 0;
  vector<crnlib::vec<3U,_int>_>::vector((vector<crnlib::vec<3U,_int>_> *)(in_RDI + 0x122));
  new_capacity = (uint)((ulong)local_78 >> 0x20);
  vector<crnlib::vec<3U,_int>_>::vector((vector<crnlib::vec<3U,_int>_> *)(in_RDI + 0x124));
  potential_solution::potential_solution(in_stack_ffffffffffffff50);
  potential_solution::potential_solution(in_stack_ffffffffffffff50);
  hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
  ::hash_map((hash_map<unsigned_int,_crnlib::empty_type,_crnlib::hasher<unsigned_int>,_crnlib::equal_to<unsigned_int>_>
              *)(in_RDI + 0x130));
  vector<crnlib::vec<3U,_float>_>::reserve((vector<crnlib::vec<3U,_float>_> *)this_00,new_capacity);
  vector<crnlib::vec<3U,_float>_>::reserve((vector<crnlib::vec<3U,_float>_> *)this_00,new_capacity);
  vector<crnlib::unique_color>::reserve(this_00,new_capacity);
  vector<crnlib::unique_color>::reserve(this_00,new_capacity);
  vector<unsigned_short>::reserve((vector<unsigned_short> *)this_00,new_capacity);
  vector<crnlib::vec<3U,_float>_>::reserve((vector<crnlib::vec<3U,_float>_> *)this_00,new_capacity);
  vector<crnlib::vec<3U,_float>_>::reserve((vector<crnlib::vec<3U,_float>_> *)this_00,new_capacity);
  vector<crnlib::vec<3U,_int>_>::reserve((vector<crnlib::vec<3U,_int>_> *)this_00,new_capacity);
  vector<crnlib::vec<3U,_int>_>::reserve((vector<crnlib::vec<3U,_int>_> *)this_00,new_capacity);
  return;
}

Assistant:

dxt1_endpoint_optimizer::dxt1_endpoint_optimizer()
    : m_pParams(NULL),
      m_pResults(NULL),
      m_perceptual(false),
      m_num_prev_results(0) {
  m_low_coords.reserve(512);
  m_high_coords.reserve(512);

  m_unique_colors.reserve(512);
  m_temp_unique_colors.reserve(512);
  m_unique_packed_colors.reserve(512);

  m_norm_unique_colors.reserve(512);
  m_norm_unique_colors_weighted.reserve(512);

  m_lo_cells.reserve(128);
  m_hi_cells.reserve(128);
}